

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_pspr.cpp
# Opt level: O3

DPSprite * __thiscall player_t::FindPSprite(player_t *this,int layer)

{
  DPSprite *pDVar1;
  anon_union_8_2_947301c2_for_TObjPtr<DPSprite>_1 *paVar2;
  DPSprite *pDVar3;
  
  if ((layer != 0) && (pDVar1 = (this->psprites).field_0.p, pDVar1 != (DPSprite *)0x0)) {
    if (((pDVar1->super_DObject).ObjectFlags & 0x20) == 0) {
      do {
        pDVar3 = pDVar1;
        if (pDVar3->ID == layer) {
          return pDVar3;
        }
        pDVar1 = (pDVar3->Next).field_0.p;
        if (pDVar1 == (DPSprite *)0x0) {
          return (DPSprite *)0x0;
        }
      } while (((pDVar1->super_DObject).ObjectFlags & 0x20) == 0);
      paVar2 = &(pDVar3->Next).field_0;
    }
    else {
      paVar2 = &(this->psprites).field_0;
    }
    *paVar2 = (anon_union_8_2_947301c2_for_TObjPtr<DPSprite>_1)0x0;
  }
  return (DPSprite *)0x0;
}

Assistant:

DPSprite *player_t::FindPSprite(int layer)
{
	if (layer == 0)
		return nullptr;

	DPSprite *pspr = psprites;
	while (pspr)
	{
		if (pspr->ID == layer)
			break;

		pspr = pspr->Next;
	}

	return pspr;
}